

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalCodeEditor_UNIX.cxx
# Opt level: O0

int make_args(char *s,int *aargc,char ***aargv)

{
  size_t sVar1;
  char **ppcVar2;
  int local_3c;
  int t;
  char **argv;
  char *ss;
  char ***aargv_local;
  int *aargc_local;
  char *s_local;
  
  sVar1 = strlen(s);
  ppcVar2 = (char **)malloc((sVar1 >> 1) << 3);
  if (ppcVar2 == (char **)0x0) {
    s_local._4_4_ = -1;
  }
  else {
    local_3c = 0;
    while( true ) {
      if (local_3c == 0) {
        argv = (char **)strtok(s," \t");
      }
      else {
        argv = (char **)strtok((char *)0x0," \t");
      }
      if (argv == (char **)0x0) break;
      ppcVar2[local_3c] = (char *)argv;
      local_3c = local_3c + 1;
    }
    ppcVar2[local_3c] = (char *)0x0;
    *aargv = ppcVar2;
    *aargc = local_3c;
    s_local._4_4_ = local_3c;
  }
  return s_local._4_4_;
}

Assistant:

static int make_args(char *s,         // string containing words (gets trashed!)
                     int *aargc,      // pointer to argc
                     char ***aargv) { // pointer to argv
  char *ss, **argv;
  if ((argv=(char**)malloc(sizeof(char*) * (strlen(s)/2)))==NULL) {
    return -1;
  }
  int t;
  for(t=0; (t==0)?(ss=strtok(s," \t")):(ss=strtok(0," \t")); t++) {
    argv[t] = ss;
  }
  argv[t] = 0;
  aargv[0] = argv;
  aargc[0] = t;
  return(t);
}